

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O1

int width_from_owner_or_zero_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  Am_Value *this;
  Am_Slot_Key key;
  Am_Object owner;
  Am_Object local_20;
  Am_Object local_18;
  
  iVar2 = 0;
  Am_Object::Get_Object(&local_20,(Am_Slot_Key)self,10);
  bVar1 = Am_Object::Valid(&local_20);
  if (bVar1) {
    Am_Object::Am_Object(&local_18,&Am_Scrolling_Group);
    bVar1 = Am_Object::Is_Instance_Of(&local_20,&local_18);
    Am_Object::~Am_Object(&local_18);
    key = 0x66;
    if (bVar1) {
      key = 0x18e;
    }
    this = Am_Object::Get(&local_20,key,0);
    iVar2 = Am_Value::operator_cast_to_int(this);
  }
  Am_Object::~Am_Object(&local_20);
  return iVar2;
}

Assistant:

Am_Define_Formula(int, width_from_owner_or_zero)
{
  Am_Object owner = self.Get_Owner();
  if (owner.Valid()) {
    if (owner.Is_Instance_Of(Am_Scrolling_Group))
      return owner.Get(Am_INNER_WIDTH);
    else
      return owner.Get(Am_WIDTH);
  } else
    return 0;
}